

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

int Ivy_FastMapNodeFaninCost(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Supp_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  int local_2c;
  int Counter;
  Ivy_Obj_t *pFanin;
  Ivy_Supp_t *pSuppF;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *pAig_local;
  
  local_2c = 0;
  iVar1 = Ivy_ObjIsNode(pObj);
  if (iVar1 != 0) {
    pIVar2 = Ivy_ObjSupp(pAig,pObj);
    if (pIVar2->nRefs == 0) {
      local_2c = -1;
    }
    pIVar3 = Ivy_ObjFanin0(pObj);
    pIVar2 = Ivy_ObjSupp(pAig,pIVar3);
    iVar1 = Ivy_ObjIsTravIdCurrent(pAig,pIVar3);
    if ((iVar1 == 0) && (pIVar2->nRefs == 0)) {
      local_2c = local_2c + 1;
    }
    pIVar3 = Ivy_ObjFanin1(pObj);
    pIVar2 = Ivy_ObjSupp(pAig,pIVar3);
    iVar1 = Ivy_ObjIsTravIdCurrent(pAig,pIVar3);
    if ((iVar1 == 0) && (pIVar2->nRefs == 0)) {
      local_2c = local_2c + 1;
    }
    return local_2c;
  }
  __assert_fail("Ivy_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                ,0x48c,"int Ivy_FastMapNodeFaninCost(Ivy_Man_t *, Ivy_Obj_t *)");
}

Assistant:

int Ivy_FastMapNodeFaninCost( Ivy_Man_t * pAig, Ivy_Obj_t * pObj )
{
    Ivy_Supp_t * pSuppF;
    Ivy_Obj_t * pFanin;
    int Counter = 0;
    assert( Ivy_ObjIsNode(pObj) );
    // check if the node has external refs
    pSuppF = Ivy_ObjSupp( pAig, pObj );
    if ( pSuppF->nRefs == 0 )
        Counter--;
    // increment the number of fanins without external refs
    pFanin = Ivy_ObjFanin0(pObj);
    pSuppF = Ivy_ObjSupp( pAig, pFanin );
    if ( !Ivy_ObjIsTravIdCurrent(pAig, pFanin) && pSuppF->nRefs == 0 )
        Counter++;
    // increment the number of fanins without external refs
    pFanin = Ivy_ObjFanin1(pObj);
    pSuppF = Ivy_ObjSupp( pAig, pFanin );
    if ( !Ivy_ObjIsTravIdCurrent(pAig, pFanin) && pSuppF->nRefs == 0 )
        Counter++;
    return Counter;
}